

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,bool *value)

{
  int *piVar1;
  bool bVar2;
  uint64_t pos;
  bool bVar3;
  char sc;
  string tok;
  char local_42;
  allocator local_41;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  pos = CurrLoc(this);
  bVar2 = ReadIdentifier(this,&local_40);
  if (bVar2) {
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_40,"true");
    bVar3 = true;
    if (bVar2) {
LAB_002e0439:
      *value = bVar3;
      ::std::__cxx11::string::_M_dispose();
      return true;
    }
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_40,"false");
    if (bVar2) {
      bVar3 = false;
      goto LAB_002e0439;
    }
  }
  SeekTo(this,pos);
  ::std::__cxx11::string::_M_dispose();
  bVar2 = Char1(this,&local_42);
  if (bVar2) {
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    if (local_42 == '1') {
      *value = true;
    }
    else {
      if (local_42 != '0') {
        ::std::__cxx11::string::string((string *)&local_40,"\'0\' or \'1\' expected.\n",&local_41);
        PushError(this,&local_40);
        ::std::__cxx11::string::_M_dispose();
        goto LAB_002e04bb;
      }
      *value = false;
    }
    bVar2 = true;
  }
  else {
LAB_002e04bb:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ReadBasicType(bool *value) {
  // 'true', 'false', '0' or '1'
  {
    std::string tok;

    auto loc = CurrLoc();
    bool ok = ReadIdentifier(&tok);

    if (ok) {
      if (tok == "true") {
        (*value) = true;
        return true;
      } else if (tok == "false") {
        (*value) = false;
        return true;
      }
    }

    // revert
    SeekTo(loc);
  }

  char sc;
  if (!Char1(&sc)) {
    return false;
  }
  _curr_cursor.col++;

  // sign or [0-9]
  if (sc == '0') {
    (*value) = false;
    return true;
  } else if (sc == '1') {
    (*value) = true;
    return true;
  } else {
    PushError("'0' or '1' expected.\n");
    return false;
  }
}